

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<short>::test_vectordivide_numerators<(libdivide::Branching)1>
          (DivideTest<short> *this,short denom,divider<short,_(libdivide::Branching)1> *the_divider)

{
  short sVar1;
  short *in_RDX;
  undefined2 in_SI;
  DivideTest<short> *in_RDI;
  divider<short,_(libdivide::Branching)1> *unaff_retaddr;
  short in_stack_0000000e;
  size_t j;
  size_t i;
  short *numers;
  size_t offset;
  char mem [128];
  ulong local_b8;
  ulong local_b0;
  undefined1 local_98 [64];
  short asStack_58 [20];
  divider<short,_(libdivide::Branching)1> *in_stack_ffffffffffffffd0;
  short in_stack_ffffffffffffffde;
  size_t in_stack_ffffffffffffffe0;
  undefined6 in_stack_fffffffffffffff0;
  
  for (local_b0 = 0; local_b0 < 10000; local_b0 = local_b0 + 1) {
    for (local_b8 = 0; local_b8 < 0x20; local_b8 = local_b8 + 1) {
      sVar1 = get_random(in_RDI);
      *(short *)((long)asStack_58 + (local_b8 * 2 - ((ulong)local_98 & 0x3f))) = sVar1;
    }
    test_vec<long_long__vector(2),(libdivide::Branching)1>
              ((DivideTest<short> *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_RDX,
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde,in_stack_ffffffffffffffd0);
    test_vec<long_long__vector(4),(libdivide::Branching)1>
              ((DivideTest<short> *)numers,(short *)i,j,in_stack_0000000e,unaff_retaddr);
    test_vec<long_long__vector(8),(libdivide::Branching)1>
              ((DivideTest<short> *)mem._112_8_,(short *)mem._104_8_,mem._96_8_,mem._94_2_,
               (divider<short,_(libdivide::Branching)1> *)mem._80_8_);
  }
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }